

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O2

void __thiscall
Annotator_assignResetId_Test::~Annotator_assignResetId_Test(Annotator_assignResetId_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Annotator, assignResetId)
{
    auto annotator = libcellml::Annotator::create();
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(modelStringNoIds);

    auto reset = model->component("component2")->reset(0);

    annotator->setModel(model);

    EXPECT_EQ("", reset->id());
    EXPECT_EQ("", reset->testValueId());
    EXPECT_EQ("", reset->resetValueId());

    annotator->assignId(reset);
    EXPECT_EQ("b4da55", reset->id());
    annotator->assignId(reset, libcellml::CellmlElementType::TEST_VALUE);
    EXPECT_EQ("b4da56", reset->testValueId());
    annotator->assignId(reset, libcellml::CellmlElementType::RESET_VALUE);
    EXPECT_EQ("b4da57", reset->resetValueId());
}